

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Declaration_Object.cpp
# Opt level: O0

void __thiscall
psy::C::ObjectDeclarationSymbol::ObjectDeclarationImpl::ObjectDeclarationImpl
          (ObjectDeclarationImpl *this,SymbolKind symK,Symbol *containingSym,SyntaxTree *tree,
          Scope *enclosingScope)

{
  Scope *enclosingScope_local;
  SyntaxTree *tree_local;
  Symbol *containingSym_local;
  SymbolKind symK_local;
  ObjectDeclarationImpl *this_local;
  
  DeclarationSymbol::DeclarationImpl::DeclarationImpl
            (&this->super_DeclarationImpl,symK,containingSym,tree,enclosingScope,OrdinaryIdentifiers
            );
  this->name_ = (Identifier *)0x0;
  this->ty_ = (Type *)0x0;
  return;
}

Assistant:

ObjectDeclarationImpl(SymbolKind symK,
                          const Symbol* containingSym,
                          const SyntaxTree* tree,
                          const Scope* enclosingScope)
        : DeclarationImpl(symK,
                          containingSym,
                          tree,
                          enclosingScope,
                          NameSpace::OrdinaryIdentifiers)
        , name_(nullptr)
        , ty_(nullptr)
    {}